

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall Scene::Scene(Scene *this,int materials_size,int textures_size,int objects_size)

{
  Material **ppMVar1;
  Texture **ppTVar2;
  Object **ppOVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  this->m_materials_size = materials_size;
  this->m_textures_size = textures_size;
  this->m_objects_size = objects_size;
  uVar5 = 0;
  uVar4 = 0xffffffffffffffff;
  uVar6 = (ulong)(uint)materials_size << 3;
  if (materials_size < 0) {
    uVar6 = uVar4;
  }
  uVar7 = (ulong)(uint)materials_size;
  if (materials_size < 1) {
    uVar7 = uVar5;
  }
  ppMVar1 = (Material **)operator_new__(uVar6);
  this->m_materials = ppMVar1;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    this->m_materials[uVar5] = (Material *)0x0;
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)textures_size << 3;
  if (textures_size < 0) {
    uVar6 = uVar4;
  }
  uVar7 = (ulong)(uint)textures_size;
  if (textures_size < 1) {
    uVar7 = uVar5;
  }
  ppTVar2 = (Texture **)operator_new__(uVar6);
  this->m_textures = ppTVar2;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    this->m_textures[uVar5] = (Texture *)0x0;
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)objects_size << 3;
  if (objects_size < 0) {
    uVar6 = uVar4;
  }
  uVar4 = (ulong)(uint)objects_size;
  if (objects_size < 1) {
    uVar4 = uVar5;
  }
  ppOVar3 = (Object **)operator_new__(uVar6);
  this->m_objects = ppOVar3;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    this->m_objects[uVar5] = (Object *)0x0;
  }
  return;
}

Assistant:

Scene::Scene(int materials_size, int textures_size, int objects_size)
: m_materials_size(materials_size), m_textures_size(textures_size) , m_objects_size(objects_size)
{
    m_materials = new Material *[m_materials_size];
    for(int i=0; i<m_materials_size; ++i) {
        m_materials[i] = nullptr;
    }

    m_textures = new Texture *[m_textures_size];
    for(int i=0; i<m_textures_size; ++i) {
        m_textures[i] = nullptr;
    }

    m_objects = new Object *[m_objects_size];
    for(int i=0; i<m_objects_size; ++i) {
        m_objects[i] = nullptr;
    }
}